

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,uint *out,char **errPos,int param_4)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  unsigned_long_long *unaff_retaddr;
  unsigned_long_long temp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar1 = parseUnsigned((char **)temp,unaff_retaddr,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (bVar1) {
    *in_RSI = 0;
    iVar2 = parsed(1,in_RDI,in_RDX);
  }
  else {
    iVar2 = parsed(0,in_RDI,in_RDX);
  }
  return iVar2;
}

Assistant:

int xconvert(const char* x, unsigned& out, const char** errPos, int) {
	unsigned long long temp = 0;
	if (parseUnsigned(x, temp, UINT_MAX)) {
		out = static_cast<unsigned>(temp);
		return parsed(1, x, errPos);
	}
	return parsed(0, x, errPos);
}